

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int Connectubloxx(UBLOX *publox,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsublox[lVar2] == (void *)0x0) {
      iVar1 = Connectublox(publox,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsublox[lVar2] = publox;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int Connectubloxx(UBLOX* publox, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Connectublox(publox, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = publox;

	return EXIT_SUCCESS;
}